

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

string * __thiscall
Diligent::Parsing::
RefinePreprocessorDirective<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  bool bVar1;
  reference pcVar2;
  allocator<char> local_51;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DirectiveEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DirectiveStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *End_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Start_local;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,Start);
  if ((!bVar1) &&
     (pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this), *pcVar2 == '#')) {
    DirectiveEnd = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)this,1);
    local_30 = SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (&DirectiveEnd,Start," \t",SKIP_COMMENT_FLAG_MULTILINE);
    local_50 = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (&local_30,Start);
    local_48._M_current = local_30._M_current;
    local_40 = local_50._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,local_48,local_50,&local_51);
    std::allocator<char>::~allocator(&local_51);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"",(allocator *)((long)&DirectiveStart._M_current + 7)
            );
  std::allocator<char>::~allocator((allocator<char> *)((long)&DirectiveStart._M_current + 7));
  return __return_storage_ptr__;
}

Assistant:

std::string RefinePreprocessorDirective(const InteratorType& Start, const InteratorType& End) noexcept
{
    // # /* Comment */ define
    // ^
    // Pos
    if (Start == End || *Start != '#')
        return "";

    const auto DirectiveStart = SkipDelimitersAndComments(Start + 1, End, " \t", SKIP_COMMENT_FLAG_MULTILINE);
    // # /* Comment */ define
    //                 ^
    //          DirectiveStart

    const auto DirectiveEnd = SkipIdentifier(DirectiveStart, End);
    // # /* Comment */ define
    //                       ^
    //                      Pos

    return std::string{DirectiveStart, DirectiveEnd};
}